

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O3

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  uv_stream_t *__size;
  void *__s;
  long lVar5;
  undefined1 auVar6 [16];
  uv_stream_t uStack_178;
  uv_stream_t *apuStack_70 [8];
  
  lVar4 = 0;
  bytes_written = 0;
  bytes_read = 0;
  do {
    apuStack_70[0] = (uv_stream_t *)0x1617c0;
    pvVar2 = malloc(0x60c0);
    if (pvVar2 == (void *)0x0) {
      apuStack_70[0] = (uv_stream_t *)0x161897;
      do_writes_and_reads_cold_6();
LAB_00161897:
      apuStack_70[0] = (uv_stream_t *)0x16189c;
      do_writes_and_reads_cold_1();
      goto LAB_0016189c;
    }
    __s = (void *)((long)pvVar2 + 0xc0);
    lVar5 = 8;
    do {
      apuStack_70[0] = (uv_stream_t *)0x1617ee;
      memset(__s,0x2a,0x2000);
      apuStack_70[0] = (uv_stream_t *)0x1617fb;
      auVar6 = uv_buf_init(__s,0x2000);
      *(long *)((long)apuStack_70 + lVar5) = auVar6._0_8_;
      *(long *)((long)apuStack_70 + lVar5 + 8U) = auVar6._8_8_;
      lVar5 = lVar5 + 0x10;
      __s = (void *)((long)__s + 3);
    } while (lVar5 != 0x38);
    apuStack_70[0] = (uv_stream_t *)0x16182c;
    iVar1 = uv_write(pvVar2,handle,apuStack_70 + 1,3,write_cb);
    if (iVar1 != 0) goto LAB_00161897;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  apuStack_70[0] = (uv_stream_t *)0x161856;
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  if (iVar1 == 0) {
    apuStack_70[0] = (uv_stream_t *)0x161865;
    iVar1 = uv_run(handle->loop,0);
    if (iVar1 != 0) goto LAB_001618a1;
    if (bytes_written != 0x600000) goto LAB_001618a6;
    if (bytes_read == 0x600000) {
      return;
    }
  }
  else {
LAB_0016189c:
    apuStack_70[0] = (uv_stream_t *)0x1618a1;
    do_writes_and_reads_cold_2();
LAB_001618a1:
    apuStack_70[0] = (uv_stream_t *)0x1618a6;
    do_writes_and_reads_cold_3();
LAB_001618a6:
    apuStack_70[0] = (uv_stream_t *)0x1618ab;
    do_writes_and_reads_cold_4();
  }
  apuStack_70[0] = (uv_stream_t *)ipc_helper_heavy_traffic_deadlock_bug;
  do_writes_and_reads_cold_5();
  apuStack_70[0] = handle;
  uVar3 = uv_default_loop();
  __size = &uStack_178;
  iVar1 = uv_pipe_init(uVar3,__size,1);
  if (iVar1 == 0) {
    __size = (uv_stream_t *)0x0;
    iVar1 = uv_pipe_open(&uStack_178);
    if (iVar1 == 0) {
      notify_parent_process();
      do_writes_and_reads(&uStack_178);
      uv_sleep(100);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      __size = (uv_stream_t *)0x0;
      uv_run(uVar3);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00161945;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_00161945:
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar2 = malloc((size_t)__size);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = (long)(int)__size;
  return;
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT(r == 0);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(bytes_written == XFER_SIZE);
  ASSERT(bytes_read == XFER_SIZE);
}